

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbisetb.cpp
# Opt level: O1

void __thiscall icu_63::RBBISetBuilder::buildTrie(RBBISetBuilder *this)

{
  UTrie2 *pUVar1;
  RangeDescriptor *pRVar2;
  
  pUVar1 = utrie2_open_63(0,0,this->fStatus);
  this->fTrie = pUVar1;
  pRVar2 = this->fRangeList;
  while ((pRVar2 != (RangeDescriptor *)0x0 && (*this->fStatus < U_ILLEGAL_ARGUMENT_ERROR))) {
    utrie2_setRange32_63
              (this->fTrie,pRVar2->fStartChar,pRVar2->fEndChar,pRVar2->fNum,'\x01',this->fStatus);
    pRVar2 = pRVar2->fNext;
  }
  return;
}

Assistant:

void RBBISetBuilder::buildTrie() {
    RangeDescriptor *rlRange;

    fTrie = utrie2_open(0,       //  Initial value for all code points.
                        0,       //  Error value for out-of-range input.
                        fStatus);

    for (rlRange = fRangeList; rlRange!=0 && U_SUCCESS(*fStatus); rlRange=rlRange->fNext) {
        utrie2_setRange32(fTrie,
                          rlRange->fStartChar,     // Range start
                          rlRange->fEndChar,       // Range end (inclusive)
                          rlRange->fNum,           // value for range
                          TRUE,                    // Overwrite previously written values
                          fStatus);
    }
}